

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection_manager.cpp
# Opt level: O0

vector<duckdb::shared_ptr<duckdb::ClientContext,_true>,_true> * __thiscall
duckdb::ConnectionManager::GetConnectionList(ConnectionManager *this)

{
  bool bVar1;
  __int_type in_RSI;
  unordered_map<std::reference_wrapper<duckdb::ClientContext>,_duckdb::weak_ptr<duckdb::ClientContext,_true>,_duckdb::ReferenceHashFunction<duckdb::ClientContext>,_duckdb::ReferenceEquality<duckdb::ClientContext>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::ClientContext>,_duckdb::weak_ptr<duckdb::ClientContext,_true>_>_>_>
  *in_RDI;
  shared_ptr<duckdb::ClientContext,_true> connection;
  pair<const_std::reference_wrapper<duckdb::ClientContext>,_duckdb::weak_ptr<duckdb::ClientContext,_true>_>
  *it;
  iterator __end1;
  iterator __begin1;
  reference_map_t<ClientContext,_weak_ptr<ClientContext>_> *__range1;
  lock_guard<std::mutex> lock;
  vector<duckdb::shared_ptr<duckdb::ClientContext,_true>,_true> *result;
  unordered_map<std::reference_wrapper<duckdb::ClientContext>,_duckdb::weak_ptr<duckdb::ClientContext,_true>,_duckdb::ReferenceHashFunction<duckdb::ClientContext>,_duckdb::ReferenceEquality<duckdb::ClientContext>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::ClientContext>,_duckdb::weak_ptr<duckdb::ClientContext,_true>_>_>_>
  *this_00;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  weak_ptr<duckdb::ClientContext,_true> *in_stack_ffffffffffffffb8;
  _Node_iterator_base<std::pair<const_std::reference_wrapper<duckdb::ClientContext>,_duckdb::weak_ptr<duckdb::ClientContext,_true>_>,_true>
  local_38;
  _Node_iterator_base<std::pair<const_std::reference_wrapper<duckdb::ClientContext>,_duckdb::weak_ptr<duckdb::ClientContext,_true>_>,_true>
  local_30;
  long local_28;
  undefined1 local_19;
  
  this_00 = in_RDI;
  ::std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)in_RDI,(mutex_type *)in_RDI);
  local_19 = 0;
  vector<duckdb::shared_ptr<duckdb::ClientContext,_true>,_true>::vector
            ((vector<duckdb::shared_ptr<duckdb::ClientContext,_true>,_true> *)0x87830d);
  local_28 = in_RSI + 0x28;
  local_30._M_cur =
       (__node_type *)
       ::std::
       unordered_map<std::reference_wrapper<duckdb::ClientContext>,_duckdb::weak_ptr<duckdb::ClientContext,_true>,_duckdb::ReferenceHashFunction<duckdb::ClientContext>,_duckdb::ReferenceEquality<duckdb::ClientContext>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::ClientContext>,_duckdb::weak_ptr<duckdb::ClientContext,_true>_>_>_>
       ::begin(in_RDI);
  local_38._M_cur =
       (__node_type *)
       ::std::
       unordered_map<std::reference_wrapper<duckdb::ClientContext>,_duckdb::weak_ptr<duckdb::ClientContext,_true>,_duckdb::ReferenceHashFunction<duckdb::ClientContext>,_duckdb::ReferenceEquality<duckdb::ClientContext>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::ClientContext>,_duckdb::weak_ptr<duckdb::ClientContext,_true>_>_>_>
       ::end(in_RDI);
  while (bVar1 = ::std::__detail::operator!=(&local_30,&local_38), bVar1) {
    ::std::__detail::
    _Node_iterator<std::pair<const_std::reference_wrapper<duckdb::ClientContext>,_duckdb::weak_ptr<duckdb::ClientContext,_true>_>,_false,_true>
    ::operator*((_Node_iterator<std::pair<const_std::reference_wrapper<duckdb::ClientContext>,_duckdb::weak_ptr<duckdb::ClientContext,_true>_>,_false,_true>
                 *)0x87835b);
    weak_ptr<duckdb::ClientContext,_true>::lock(in_stack_ffffffffffffffb8);
    bVar1 = duckdb::shared_ptr::operator_cast_to_bool
                      ((shared_ptr<duckdb::ClientContext,_true> *)0x87837f);
    if (bVar1) {
      ::std::
      vector<duckdb::shared_ptr<duckdb::ClientContext,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ClientContext,_true>_>_>
      ::push_back((vector<duckdb::shared_ptr<duckdb::ClientContext,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ClientContext,_true>_>_>
                   *)this_00,(value_type *)in_RDI);
      in_stack_ffffffffffffffa0 = 0;
    }
    else {
      ::std::
      unordered_map<std::reference_wrapper<duckdb::ClientContext>,_duckdb::weak_ptr<duckdb::ClientContext,_true>,_duckdb::ReferenceHashFunction<duckdb::ClientContext>,_duckdb::ReferenceEquality<duckdb::ClientContext>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::ClientContext>,_duckdb::weak_ptr<duckdb::ClientContext,_true>_>_>_>
      ::erase(this_00,(key_type *)in_RDI);
      ::std::
      unordered_map<std::reference_wrapper<duckdb::ClientContext>,_duckdb::weak_ptr<duckdb::ClientContext,_true>,_duckdb::ReferenceHashFunction<duckdb::ClientContext>,_duckdb::ReferenceEquality<duckdb::ClientContext>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::ClientContext>,_duckdb::weak_ptr<duckdb::ClientContext,_true>_>_>_>
      ::size((unordered_map<std::reference_wrapper<duckdb::ClientContext>,_duckdb::weak_ptr<duckdb::ClientContext,_true>,_duckdb::ReferenceHashFunction<duckdb::ClientContext>,_duckdb::ReferenceEquality<duckdb::ClientContext>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::ClientContext>,_duckdb::weak_ptr<duckdb::ClientContext,_true>_>_>_>
              *)0x8783a6);
      ::std::__atomic_base<unsigned_long>::operator=
                ((__atomic_base<unsigned_long> *)
                 CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),in_RSI);
      in_stack_ffffffffffffffa0 = 3;
    }
    shared_ptr<duckdb::ClientContext,_true>::~shared_ptr
              ((shared_ptr<duckdb::ClientContext,_true> *)0x878413);
    ::std::__detail::
    _Node_iterator<std::pair<const_std::reference_wrapper<duckdb::ClientContext>,_duckdb::weak_ptr<duckdb::ClientContext,_true>_>,_false,_true>
    ::operator++((_Node_iterator<std::pair<const_std::reference_wrapper<duckdb::ClientContext>,_duckdb::weak_ptr<duckdb::ClientContext,_true>_>,_false,_true>
                  *)this_00);
  }
  local_19 = 1;
  ::std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x878458);
  return (vector<duckdb::shared_ptr<duckdb::ClientContext,_true>,_true> *)in_RDI;
}

Assistant:

vector<shared_ptr<ClientContext>> ConnectionManager::GetConnectionList() {
	lock_guard<mutex> lock(connections_lock);
	vector<shared_ptr<ClientContext>> result;
	for (auto &it : connections) {
		auto connection = it.second.lock();
		if (!connection) {
			connections.erase(it.first);
			connection_count = connections.size();
			continue;
		} else {
			result.push_back(std::move(connection));
		}
	}

	return result;
}